

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O0

bool __thiscall
Protocol::MQTT::V5::PropertiesView::getProperty(PropertiesView *this,VisitorVariant *visitor)

{
  uint8 propertyType;
  uint8 *puVar1;
  bool bVar2;
  uint32 uVar3;
  uint32 uVar4;
  MemMappedPropertyRegistry *this_00;
  uint32 r;
  uint8 t;
  uint32 offset;
  VisitorVariant *visitor_local;
  PropertiesView *this_local;
  
  VisitorVariant::propertyType(visitor,BadProperty);
  uVar3 = VisitorVariant::getOffset(visitor);
  uVar4 = Common::VBInt::operator_cast_to_unsigned_int(&this->length);
  if ((uVar3 < uVar4) && (this->buffer != (uint8 *)0x0)) {
    propertyType = this->buffer[uVar3];
    this_00 = MemMappedPropertyRegistry::getInstance();
    bVar2 = MemMappedPropertyRegistry::getVisitorForProperty(this_00,visitor,propertyType);
    if (bVar2) {
      puVar1 = this->buffer;
      uVar4 = Common::VBInt::operator_cast_to_unsigned_int(&this->length);
      uVar4 = VisitorVariant::acceptBuffer(visitor,puVar1 + (uVar3 + 1),(uVar4 - uVar3) - 1);
      bVar2 = Common::isError(uVar4);
      if (bVar2) {
        this_local._7_1_ = false;
      }
      else {
        VisitorVariant::setOffset(visitor,uVar3 + uVar4 + 1);
        this_local._7_1_ = true;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool getProperty(VisitorVariant & visitor) const
                {
                    visitor.propertyType(BadProperty);
                    const uint32 offset = visitor.getOffset();
                    if (offset >= (uint32)length || !buffer) return false;
                    // Deduce property type from the given byte
                    uint8 t = buffer[offset];
                    if (!MemMappedPropertyRegistry::getInstance().getVisitorForProperty(visitor, t)) return 0;
                    // Then visit the property now
                    uint32 r = visitor.acceptBuffer(&buffer[offset + 1], (uint32)length - offset - 1);
                    if (isError(r)) return false;
                    visitor.setOffset(offset + r + 1);
                    return true;
                }